

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_parser.cpp
# Opt level: O0

void __thiscall
HawkTracer::ClientUtils::CommandLineParser::register_option
          (CommandLineParser *this,string *name,OptionInfo *option_info)

{
  ostream *poVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>
  local_68;
  OptionInfo *local_20;
  OptionInfo *option_info_local;
  string *name_local;
  CommandLineParser *this_local;
  
  local_20 = option_info;
  option_info_local = (OptionInfo *)name;
  name_local = (string *)this;
  if (((option_info->is_flag & 1U) == 0) || ((option_info->is_mandatory & 1U) == 0)) {
    std::make_pair<std::__cxx11::string,HawkTracer::ClientUtils::CommandLineParser::OptionInfo>
              (&local_68,name,option_info);
    std::
    unordered_map<std::__cxx11::string,HawkTracer::ClientUtils::CommandLineParser::OptionInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,HawkTracer::ClientUtils::CommandLineParser::OptionInfo>>>
    ::insert<std::pair<std::__cxx11::string,HawkTracer::ClientUtils::CommandLineParser::OptionInfo>>
              ((unordered_map<std::__cxx11::string,HawkTracer::ClientUtils::CommandLineParser::OptionInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,HawkTracer::ClientUtils::CommandLineParser::OptionInfo>>>
                *)this,&local_68);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::ClientUtils::CommandLineParser::OptionInfo>
    ::~pair(&local_68);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Unable to register option ");
    poVar1 = std::operator<<(poVar1,(string *)name);
    poVar1 = std::operator<<(poVar1,": option can\'t be flag and mandatory at the same time");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void CommandLineParser::register_option(std::string name, OptionInfo option_info)
{
    if (option_info.is_flag && option_info.is_mandatory)
    {
        std::cerr << "Unable to register option " << name
                  << ": option can't be flag and mandatory at the same time" << std::endl;
    }
    else
    {
        _registered_options.insert(std::make_pair(std::move(name), std::move(option_info)));
    }
}